

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

bool EditTraceResult(DWORD flags,FTraceResults *res)

{
  bool bVar1;
  bool local_21;
  FTextureID local_20;
  FTextureID local_1c;
  FTraceResults *local_18;
  FTraceResults *res_local;
  DWORD flags_local;
  
  if ((flags & 1) != 0) {
    local_18 = res;
    res_local._0_4_ = flags;
    if ((res->HitType == TRACE_HitFloor) || (res->HitType == TRACE_HitCeiling)) {
      bVar1 = FTextureID::operator==(&res->HitTexture,&skyflatnum);
      if (bVar1) {
        local_18->HitType = TRACE_HitNone;
        return false;
      }
    }
    else if (res->HitType == TRACE_HitWall) {
      local_21 = false;
      if (res->Tier == '\x01') {
        local_1c = sector_t::GetTexture(res->Line->frontsector,1);
        bVar1 = FTextureID::operator==(&local_1c,&skyflatnum);
        local_21 = false;
        if (bVar1) {
          local_20 = sector_t::GetTexture(local_18->Line->backsector,1);
          local_21 = FTextureID::operator==(&local_20,&skyflatnum);
        }
      }
      if (local_21 != false) {
        local_18->HitType = TRACE_HitNone;
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool EditTraceResult (DWORD flags, FTraceResults &res)
{
	if (flags & TRACE_NoSky)
	{ // Throw away sky hits
		if (res.HitType == TRACE_HitFloor || res.HitType == TRACE_HitCeiling)
		{
			if (res.HitTexture == skyflatnum)
			{
				res.HitType = TRACE_HitNone;
				return false;
			}
		}
		else if (res.HitType == TRACE_HitWall)
		{
			if (res.Tier == TIER_Upper &&
				res.Line->frontsector->GetTexture(sector_t::ceiling) == skyflatnum &&
				res.Line->backsector->GetTexture(sector_t::ceiling) == skyflatnum)
			{
				res.HitType = TRACE_HitNone;
				return false;
			}
		}
	}
	return true;
}